

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O1

int Fax4Decode(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uchar uVar2;
  uint lastx;
  uint8_t *puVar3;
  long lVar4;
  uint *puVar5;
  uint32_t *puVar6;
  undefined8 uVar7;
  long lVar8;
  uint32_t *puVar9;
  int iVar10;
  byte *pbVar11;
  uint32_t *puVar12;
  undefined6 in_register_0000000a;
  char *pcVar13;
  ulong uVar14;
  byte *pbVar15;
  byte *pbVar16;
  uint *puVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint uVar20;
  int iVar21;
  TIFFFaxTabEnt *pTVar22;
  char *pcVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  uint a0;
  long lVar29;
  bool bVar30;
  int local_4c;
  
  puVar3 = tif->tif_data;
  if (occ % *(long *)(puVar3 + 8) != 0) {
    TIFFErrorExtR(tif,"Fax4Decode","Fractional scanlines cannot be read",
                  CONCAT62(in_register_0000000a,s));
    return -1;
  }
  uVar28 = *(uint *)(puVar3 + 0x48);
  iVar26 = *(int *)(puVar3 + 0x4c);
  local_4c = *(int *)(puVar3 + 0x50);
  pbVar15 = tif->tif_rawcp;
  if (0 < occ) {
    lastx = *(uint *)(puVar3 + 0x10);
    lVar4 = *(long *)(puVar3 + 0x40);
    pbVar11 = pbVar15 + tif->tif_rawcc;
    iVar10 = (int)(lastx + 7) >> 3;
    do {
      puVar5 = *(uint **)(puVar3 + 0x78);
      iVar27 = (int)puVar5;
      puVar17 = puVar5;
      if ((int)lastx < 1) {
        uVar25 = 0;
        a0 = 0;
      }
      else {
        puVar6 = *(uint32_t **)(puVar3 + 0x70);
        uVar18 = *puVar6;
        puVar12 = puVar6 + 1;
        iVar21 = 0;
        a0 = 0;
        uVar25 = 0;
        do {
          uVar20 = *(uint *)(puVar3 + 0x68);
          if (puVar5 + uVar20 <= puVar17) goto LAB_0029d3cd;
          if (iVar26 < 7) {
            if (pbVar15 < pbVar11) {
              bVar1 = *pbVar15;
              pbVar15 = pbVar15 + 1;
              uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)bVar1) << ((byte)iVar26 & 0x1f);
              iVar26 = iVar26 + 8;
            }
            else {
              bVar30 = iVar26 == 0;
              iVar26 = 7;
              pbVar16 = pbVar15;
              if (bVar30) goto LAB_0029d43f;
            }
          }
          uVar24 = uVar28 & 0x7f;
          uVar28 = uVar28 >> (TIFFFaxMainTable[uVar24].Width & 0x1f);
          iVar26 = iVar26 - (uint)TIFFFaxMainTable[uVar24].Width;
          pbVar16 = pbVar15;
          switch(TIFFFaxMainTable[uVar24].State) {
          case '\x01':
            if ((puVar17 != puVar5) && ((int)uVar18 < (int)lastx && (int)uVar18 <= (int)a0)) {
              puVar9 = puVar12 + 1;
              do {
                puVar12 = puVar9;
                if (puVar6 + uVar20 <= puVar12) goto LAB_0029d3cd;
                uVar18 = uVar18 + puVar12[-1] + *puVar12;
              } while (((int)uVar18 <= (int)a0) && (puVar9 = puVar12 + 2, (int)uVar18 < (int)lastx))
              ;
              puVar12 = puVar12 + 1;
            }
            if (puVar6 + uVar20 <= puVar12 + 1) goto LAB_0029d3cd;
            a0 = uVar18 + *puVar12;
            uVar25 = iVar21 + uVar25 + a0;
            puVar9 = puVar12 + 1;
            puVar12 = puVar12 + 2;
            uVar19 = *puVar9 + a0;
            break;
          case '\x02':
            if (((int)puVar17 - iVar27 & 4U) == 0) {
              while( true ) {
                pbVar15 = pbVar16;
                iVar21 = iVar26;
                if (iVar26 < 0xc) {
                  if (pbVar16 < pbVar11) {
                    pbVar15 = pbVar16 + 1;
                    uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)*pbVar16) <<
                                      ((byte)iVar26 & 0x1f);
                    iVar21 = iVar26 + 8;
                    if (iVar26 < 4) {
                      if (pbVar15 < pbVar11) {
                        pbVar15 = pbVar16 + 2;
                        uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)pbVar16[1]) <<
                                          ((byte)iVar21 & 0x1f);
                        iVar21 = iVar26 + 0x10;
                      }
                      else {
                        iVar21 = 0xc;
                      }
                    }
                  }
                  else {
                    iVar21 = 0xc;
                    if (iVar26 == 0) goto LAB_0029d43f;
                  }
                }
                uVar20 = uVar28 & 0xfff;
                uVar28 = uVar28 >> (TIFFFaxWhiteTable[uVar20].Width & 0x1f);
                iVar26 = iVar21 - (uint)TIFFFaxWhiteTable[uVar20].Width;
                uVar2 = TIFFFaxWhiteTable[uVar20].State;
                pbVar16 = pbVar15;
                if ((uVar2 != '\t') && (uVar2 != '\v')) break;
                a0 = a0 + TIFFFaxWhiteTable[uVar20].Param;
                uVar25 = uVar25 + TIFFFaxWhiteTable[uVar20].Param;
              }
              if (uVar2 == '\a') {
                uVar19 = TIFFFaxWhiteTable[uVar20].Param;
                *puVar17 = uVar25 + uVar19;
                a0 = a0 + uVar19;
                uVar25 = 0;
                while( true ) {
                  pbVar15 = pbVar16;
                  iVar21 = iVar26;
                  if (iVar26 < 0xd) {
                    if (pbVar16 < pbVar11) {
                      pbVar15 = pbVar16 + 1;
                      uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)*pbVar16) <<
                                        ((byte)iVar26 & 0x1f);
                      iVar21 = iVar26 + 8;
                      if (iVar26 < 5) {
                        if (pbVar15 < pbVar11) {
                          pbVar15 = pbVar16 + 2;
                          uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)pbVar16[1]) <<
                                            ((byte)iVar21 & 0x1f);
                          iVar21 = iVar26 + 0x10;
                        }
                        else {
                          iVar21 = 0xd;
                        }
                      }
                    }
                    else {
                      iVar21 = 0xd;
                      if (iVar26 == 0) goto LAB_0029d437;
                    }
                  }
                  uVar20 = uVar28 & 0x1fff;
                  pTVar22 = TIFFFaxBlackTable + uVar20;
                  uVar28 = uVar28 >> (TIFFFaxBlackTable[uVar20].Width & 0x1f);
                  iVar26 = iVar21 - (uint)TIFFFaxBlackTable[uVar20].Width;
                  if (1 < pTVar22->State - 10) break;
                  a0 = a0 + TIFFFaxBlackTable[uVar20].Param;
                  uVar25 = uVar25 + TIFFFaxBlackTable[uVar20].Param;
                  pbVar16 = pbVar15;
                }
                if (pTVar22->State != 8) goto LAB_0029cf9f;
                uVar20 = *(uint *)(puVar3 + 0x68);
LAB_0029cee1:
                if (puVar17 + 1 < puVar5 + uVar20) {
                  uVar19 = pTVar22->Param;
                  puVar17[1] = uVar25 + uVar19;
                  a0 = a0 + uVar19;
                  puVar17 = puVar17 + 2;
                  uVar25 = 0;
                  uVar19 = uVar18;
                  if ((puVar17 != puVar5) && ((int)uVar18 < (int)lastx && (int)uVar18 <= (int)a0)) {
                    puVar9 = puVar12 + 1;
                    do {
                      puVar12 = puVar9;
                      if (puVar6 + *(uint *)(puVar3 + 0x68) <= puVar12) goto LAB_0029d42e;
                      uVar18 = uVar18 + puVar12[-1] + *puVar12;
                    } while (((int)uVar18 <= (int)a0) &&
                            (puVar9 = puVar12 + 2, (int)uVar18 < (int)lastx));
                    puVar12 = puVar12 + 1;
                    uVar19 = uVar18;
                  }
                  break;
                }
                goto LAB_0029d3cd;
              }
            }
            else {
              while( true ) {
                pbVar15 = pbVar16;
                iVar21 = iVar26;
                if (iVar26 < 0xd) {
                  if (pbVar16 < pbVar11) {
                    pbVar15 = pbVar16 + 1;
                    uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)*pbVar16) <<
                                      ((byte)iVar26 & 0x1f);
                    iVar21 = iVar26 + 8;
                    if (iVar26 < 5) {
                      if (pbVar15 < pbVar11) {
                        pbVar15 = pbVar16 + 2;
                        uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)pbVar16[1]) <<
                                          ((byte)iVar21 & 0x1f);
                        iVar21 = iVar26 + 0x10;
                      }
                      else {
                        iVar21 = 0xd;
                      }
                    }
                  }
                  else {
                    iVar21 = 0xd;
                    if (iVar26 == 0) goto LAB_0029d43f;
                  }
                }
                uVar20 = uVar28 & 0x1fff;
                uVar28 = uVar28 >> (TIFFFaxBlackTable[uVar20].Width & 0x1f);
                iVar26 = iVar21 - (uint)TIFFFaxBlackTable[uVar20].Width;
                pbVar16 = pbVar15;
                if (1 < TIFFFaxBlackTable[uVar20].State - 10) break;
                a0 = a0 + TIFFFaxBlackTable[uVar20].Param;
                uVar25 = uVar25 + TIFFFaxBlackTable[uVar20].Param;
              }
              if (TIFFFaxBlackTable[uVar20].State == 8) {
                uVar19 = TIFFFaxBlackTable[uVar20].Param;
                *puVar17 = uVar25 + uVar19;
                a0 = a0 + uVar19;
                uVar25 = 0;
                while( true ) {
                  pbVar15 = pbVar16;
                  iVar21 = iVar26;
                  if (iVar26 < 0xc) {
                    if (pbVar16 < pbVar11) {
                      pbVar15 = pbVar16 + 1;
                      uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)*pbVar16) <<
                                        ((byte)iVar26 & 0x1f);
                      iVar21 = iVar26 + 8;
                      if (iVar26 < 4) {
                        if (pbVar15 < pbVar11) {
                          pbVar15 = pbVar16 + 2;
                          uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)pbVar16[1]) <<
                                            ((byte)iVar21 & 0x1f);
                          iVar21 = iVar26 + 0x10;
                        }
                        else {
                          iVar21 = 0xc;
                        }
                      }
                    }
                    else {
                      iVar21 = 0xc;
                      if (iVar26 == 0) goto LAB_0029d437;
                    }
                  }
                  uVar20 = uVar28 & 0xfff;
                  pTVar22 = TIFFFaxWhiteTable + uVar20;
                  uVar28 = uVar28 >> (TIFFFaxWhiteTable[uVar20].Width & 0x1f);
                  iVar26 = iVar21 - (uint)TIFFFaxWhiteTable[uVar20].Width;
                  uVar2 = pTVar22->State;
                  if ((uVar2 != '\t') && (uVar2 != '\v')) break;
                  a0 = a0 + TIFFFaxWhiteTable[uVar20].Param;
                  uVar25 = uVar25 + TIFFFaxWhiteTable[uVar20].Param;
                  pbVar16 = pbVar15;
                }
                if (uVar2 == '\a') {
                  uVar20 = *(uint *)(puVar3 + 0x68);
                  goto LAB_0029cee1;
                }
LAB_0029cf9f:
                puVar17 = puVar17 + 1;
              }
            }
            bVar30 = (tif->tif_flags >> 10 & 1) == 0;
            pcVar23 = "tile";
            if (bVar30) {
              pcVar23 = "strip";
            }
            puVar12 = &tif->tif_curtile;
            if (bVar30) {
              puVar12 = &tif->tif_curstrip;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Bad code word at line %u of %s %u (x %u)",
                          (ulong)*(uint *)(puVar3 + 0x98),pcVar23,(ulong)*puVar12,a0);
            goto LAB_0029d086;
          case '\x03':
            if ((puVar17 != puVar5) && ((int)uVar18 < (int)lastx && (int)uVar18 <= (int)a0)) {
              puVar9 = puVar12 + 1;
              do {
                puVar12 = puVar9;
                if (puVar6 + uVar20 <= puVar12) goto LAB_0029d3cd;
                uVar18 = uVar18 + puVar12[-1] + *puVar12;
              } while (((int)uVar18 <= (int)a0) && (puVar9 = puVar12 + 2, (int)uVar18 < (int)lastx))
              ;
              puVar12 = puVar12 + 1;
            }
            *puVar17 = iVar21 + uVar25 + uVar18;
            if (puVar6 + *(uint *)(puVar3 + 0x68) <= puVar12) goto LAB_0029d3cd;
            puVar17 = puVar17 + 1;
            uVar19 = *puVar12;
            puVar12 = puVar12 + 1;
            uVar25 = 0;
            uVar19 = uVar19 + uVar18;
            a0 = uVar18;
            break;
          case '\x04':
            if ((puVar17 != puVar5) && ((int)uVar18 < (int)lastx && (int)uVar18 <= (int)a0)) {
              puVar9 = puVar12 + 1;
              do {
                puVar12 = puVar9;
                if (puVar6 + uVar20 <= puVar12) goto LAB_0029d3cd;
                uVar18 = uVar18 + puVar12[-1] + *puVar12;
              } while (((int)uVar18 <= (int)a0) && (puVar9 = puVar12 + 2, (int)uVar18 < (int)lastx))
              ;
              puVar12 = puVar12 + 1;
            }
            uVar19 = TIFFFaxMainTable[uVar24].Param;
            *puVar17 = iVar21 + uVar25 + uVar18 + uVar19;
            if (puVar12 < puVar6 + *(uint *)(puVar3 + 0x68)) {
              a0 = uVar19 + uVar18;
              uVar19 = uVar18 + *puVar12;
              puVar12 = puVar12 + 1;
              goto LAB_0029cea8;
            }
            goto LAB_0029d3cd;
          case '\x05':
            if ((puVar17 != puVar5) && ((int)uVar18 < (int)lastx && (int)uVar18 <= (int)a0)) {
              puVar9 = puVar12 + 1;
              do {
                puVar12 = puVar9;
                if (puVar6 + uVar20 <= puVar12) goto LAB_0029d3cd;
                uVar18 = uVar18 + puVar12[-1] + *puVar12;
              } while (((int)uVar18 <= (int)a0) && (puVar9 = puVar12 + 2, (int)uVar18 < (int)lastx))
              ;
              puVar12 = puVar12 + 1;
            }
            if ((int)uVar18 < (int)(TIFFFaxMainTable[uVar24].Param + a0))
            goto switchD_0029c8d5_caseD_7;
            iVar21 = (iVar21 + uVar18) - TIFFFaxMainTable[uVar24].Param;
            *puVar17 = uVar25 + iVar21;
            uVar19 = uVar18 - puVar12[-1];
            a0 = iVar21 + a0;
            puVar12 = puVar12 + -1;
LAB_0029cea8:
            uVar25 = 0;
            puVar17 = puVar17 + 1;
            break;
          case '\x06':
            *puVar17 = lastx - a0;
            puVar17 = puVar17 + 1;
            Fax3Extension("Fax4Decode",tif,*(uint32_t *)(puVar3 + 0x98),a0);
            goto LAB_0029d086;
          default:
            goto switchD_0029c8d5_caseD_7;
          case '\f':
            *puVar17 = lastx - a0;
            puVar17 = puVar17 + 1;
            if (iVar26 < 4) {
              if (pbVar15 < pbVar11) {
                bVar1 = *pbVar15;
                pbVar15 = pbVar15 + 1;
                uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)bVar1) << ((byte)iVar26 & 0x1f);
                iVar26 = iVar26 + 8;
              }
              else {
                bVar30 = iVar26 == 0;
                iVar26 = 4;
                if (bVar30) goto LAB_0029d43f;
              }
            }
            if ((uVar28 & 0xf) != 0) {
              Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar3 + 0x98),a0);
            }
            iVar26 = iVar26 + -4;
            uVar28 = uVar28 >> 4;
            local_4c = 1;
            goto LAB_0029d086;
          }
          uVar18 = uVar19;
          iVar21 = -a0;
        } while ((int)a0 < (int)lastx);
      }
      if (uVar25 != 0) {
        if ((int)(a0 + uVar25) < (int)lastx) {
          if (iVar26 < 1) {
            if (pbVar15 < pbVar11) {
              bVar1 = *pbVar15;
              pbVar15 = pbVar15 + 1;
              uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)bVar1) << ((byte)iVar26 & 0x1f);
              iVar26 = iVar26 + 8;
            }
            else {
              pbVar16 = pbVar15;
              if (iVar26 == 0) {
LAB_0029d43f:
                pcVar23 = "tile";
                puVar12 = &tif->tif_curtile;
                if ((tif->tif_flags >> 10 & 1) == 0) {
                  pcVar23 = "strip";
                  puVar12 = &tif->tif_curstrip;
                }
                TIFFWarningExtR(tif,"Fax4Decode","Premature EOF at line %u of %s %u (x %u)",
                                (ulong)*(uint *)(puVar3 + 0x98),pcVar23,(ulong)*puVar12,a0);
                if (uVar25 != 0) {
                  if (puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17) goto LAB_0029d5d2;
                  *puVar17 = uVar25;
                  puVar17 = puVar17 + 1;
                }
                iVar26 = 0;
                if (a0 == lastx) goto LAB_0029d4f4;
                Fax3BadLength("Fax4Decode",tif,*(uint32_t *)(puVar3 + 0x98),a0,lastx);
                if (((int)a0 <= (int)lastx) || (puVar17 <= puVar5)) goto LAB_0029d667;
                goto LAB_0029d5ad;
              }
              iVar26 = 1;
            }
          }
          if ((uVar28 & 1) == 0) {
switchD_0029c8d5_caseD_7:
            Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar3 + 0x98),a0);
            goto LAB_0029d086;
          }
          iVar26 = iVar26 + -1;
          uVar28 = uVar28 >> 1;
        }
        if (puVar17 < puVar5 + *(uint *)(puVar3 + 0x68)) {
          *puVar17 = uVar25;
          puVar17 = puVar17 + 1;
          uVar25 = 0;
          goto LAB_0029d086;
        }
LAB_0029d42e:
        uVar28 = *(uint *)(puVar3 + 0x98);
LAB_0029d3d9:
        uVar14 = (ulong)uVar28;
        bVar30 = (tif->tif_flags >> 10 & 1) == 0;
        pcVar23 = "tile";
        if (bVar30) {
          pcVar23 = "strip";
        }
        puVar12 = &tif->tif_curtile;
        if (bVar30) {
          puVar12 = &tif->tif_curstrip;
        }
        goto LAB_0029d402;
      }
      uVar25 = 0;
LAB_0029d086:
      if (uVar25 != 0) {
        if (puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17) goto LAB_0029d42e;
        *puVar17 = uVar25;
        puVar17 = puVar17 + 1;
      }
      if (a0 != lastx) {
        pcVar23 = "tile";
        puVar12 = &tif->tif_curtile;
        if ((tif->tif_flags >> 10 & 1) == 0) {
          pcVar23 = "strip";
          puVar12 = &tif->tif_curstrip;
        }
        pcVar13 = "Line length mismatch";
        if (a0 < lastx) {
          pcVar13 = "Premature EOL";
        }
        TIFFWarningExtR(tif,"Fax4Decode","%s at line %u of %s %u (got %u, expected %u)",pcVar13,
                        (ulong)*(uint *)(puVar3 + 0x98),pcVar23,*puVar12,a0,lastx);
        while (((int)lastx < (int)a0 && (puVar5 < puVar17))) {
          puVar17 = puVar17 + -1;
          a0 = a0 - *puVar17;
        }
        if ((int)a0 < (int)lastx) {
          if ((int)a0 < 1) {
            a0 = 0;
          }
          if (((int)puVar17 - iVar27 & 4U) != 0) {
            if (puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17) goto LAB_0029d614;
            *puVar17 = 0;
            puVar17 = puVar17 + 1;
          }
          if (puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17) {
LAB_0029d614:
            bVar30 = (tif->tif_flags >> 10 & 1) == 0;
            pcVar23 = "tile";
            if (bVar30) {
              pcVar23 = "strip";
            }
            uVar14 = (ulong)*(uint *)(puVar3 + 0x98);
            puVar12 = &tif->tif_curtile;
            if (bVar30) {
              puVar12 = &tif->tif_curstrip;
            }
            uVar28 = *puVar12;
            goto LAB_0029d405;
          }
          *puVar17 = lastx - a0;
          puVar17 = puVar17 + 1;
        }
        else if ((int)lastx < (int)a0) {
          if ((puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17) ||
             (*puVar17 = lastx, puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17 + 1))
          goto LAB_0029d614;
          puVar17[1] = 0;
          puVar17 = puVar17 + 2;
        }
      }
      pbVar16 = pbVar15;
      if (local_4c != 0) goto LAB_0029d4f4;
      if ((int)occ < iVar10) goto LAB_0029d721;
      (**(code **)(puVar3 + 0x58))(buf,puVar5,puVar17,lastx);
      if (puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17) {
LAB_0029d3cd:
        uVar28 = *(uint *)(puVar3 + 0x98);
        goto LAB_0029d3d9;
      }
      *puVar17 = 0;
      uVar7 = *(undefined8 *)(puVar3 + 0x78);
      lVar8 = *(long *)(puVar3 + 8);
      *(undefined8 *)(puVar3 + 0x78) = *(undefined8 *)(puVar3 + 0x70);
      *(undefined8 *)(puVar3 + 0x70) = uVar7;
      *(int *)(puVar3 + 0x98) = *(int *)(puVar3 + 0x98) + 1;
      buf = buf + lVar8;
      local_4c = 0;
      lVar29 = occ - lVar8;
      bVar30 = lVar8 <= occ;
      occ = lVar29;
    } while (lVar29 != 0 && bVar30);
  }
  *(int *)(puVar3 + 0x4c) = iVar26;
  *(uint *)(puVar3 + 0x48) = uVar28;
  *(int *)(puVar3 + 0x50) = local_4c;
  tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar15));
  tif->tif_rawcp = pbVar15;
  return 1;
LAB_0029d437:
  puVar17 = puVar17 + 1;
  goto LAB_0029d43f;
  while (puVar5 < puVar17) {
LAB_0029d5ad:
    puVar17 = puVar17 + -1;
    a0 = a0 - *puVar17;
    if ((int)a0 <= (int)lastx) break;
  }
LAB_0029d667:
  if ((int)a0 < (int)lastx) {
    uVar18 = 0;
    if (0 < (int)a0) {
      uVar18 = a0;
    }
    if (((int)puVar17 - iVar27 & 4U) == 0) {
LAB_0029d69a:
      if (puVar17 < puVar5 + *(uint *)(puVar3 + 0x68)) {
        *puVar17 = lastx - uVar18;
        puVar17 = puVar17 + 1;
        iVar26 = 0;
        goto LAB_0029d4f4;
      }
    }
    else if (puVar17 < puVar5 + *(uint *)(puVar3 + 0x68)) {
      *puVar17 = 0;
      puVar17 = puVar17 + 1;
      goto LAB_0029d69a;
    }
LAB_0029d5d2:
    bVar30 = (tif->tif_flags >> 10 & 1) == 0;
    pcVar23 = "tile";
    if (bVar30) {
      pcVar23 = "strip";
    }
    uVar14 = (ulong)*(uint *)(puVar3 + 0x98);
    puVar12 = &tif->tif_curtile;
    if (bVar30) {
      puVar12 = &tif->tif_curstrip;
    }
LAB_0029d402:
    uVar28 = *puVar12;
LAB_0029d405:
    TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",uVar14,pcVar23,
                  (ulong)uVar28);
  }
  else {
    iVar26 = 0;
    if ((int)lastx < (int)a0) {
      if ((puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17) ||
         (*puVar17 = lastx, puVar5 + *(uint *)(puVar3 + 0x68) <= puVar17 + 1)) goto LAB_0029d5d2;
      puVar17[1] = 0;
      puVar17 = puVar17 + 2;
    }
LAB_0029d4f4:
    pbVar15 = pbVar16;
    iVar27 = iVar26;
    if (iVar26 < 0xd) {
      if (pbVar16 < pbVar11) {
        pbVar15 = pbVar16 + 1;
        uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)*pbVar16) << ((byte)iVar26 & 0x1f);
        iVar27 = iVar26 + 8;
        if (iVar26 < 5) {
          if (pbVar15 < pbVar11) {
            uVar28 = uVar28 | (uint)*(byte *)(lVar4 + (ulong)pbVar16[1]) << ((byte)iVar27 & 0x1f);
            pbVar15 = pbVar16 + 2;
            iVar27 = iVar26 + 0x10;
          }
          else {
            iVar27 = 0xd;
          }
        }
      }
      else {
        iVar27 = 0xd;
        if (iVar26 == 0) {
          iVar27 = iVar26;
        }
      }
    }
    if (iVar10 <= (int)occ) {
      (**(code **)(puVar3 + 0x58))(buf,puVar5,puVar17,lastx);
      *(int *)(puVar3 + 0x4c) = iVar27 + -0xd;
      *(uint *)(puVar3 + 0x48) = uVar28 >> 0xd;
      *(int *)(puVar3 + 0x50) = local_4c;
      tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar15));
      tif->tif_rawcp = pbVar15;
      return -(uint)(*(int *)(puVar3 + 0x98) == 0) | 1;
    }
LAB_0029d721:
    TIFFErrorExtR(tif,"Fax4Decode","Buffer overrun detected : %ld bytes available, %d bits needed",
                  occ);
  }
  return -1;
}

Assistant:

static int Fax4Decode(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    DECLARE_STATE_2D(tif, sp, "Fax4Decode");
    (void)s;
    if (occ % sp->b.rowbytes)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (-1);
    }
    CACHE_STATE(tif, sp);
    while (occ > 0)
    {
        a0 = 0;
        RunLength = 0;
        pa = thisrun = sp->curruns;
        pb = sp->refruns;
        b1 = *pb++;
#ifdef FAX3_DEBUG
        printf("\nBitAcc=%08" PRIX32 ", BitsAvail = %d\n", BitAcc, BitsAvail);
        printf("-------------------- %d\n", tif->tif_row);
        fflush(stdout);
#endif
        EXPAND2D(EOFG4);
        if (EOLcnt)
            goto EOFG4;
        if (((lastx + 7) >> 3) > (int)occ) /* check for buffer overrun */
        {
            TIFFErrorExtR(tif, module,
                          "Buffer overrun detected : %" TIFF_SSIZE_FORMAT
                          " bytes available, %d bits needed",
                          occ, lastx);
            return -1;
        }
        (*sp->fill)(buf, thisrun, pa, lastx);
        SETVALUE(0); /* imaginary change for reference */
        SWAP(uint32_t *, sp->curruns, sp->refruns);
        buf += sp->b.rowbytes;
        occ -= sp->b.rowbytes;
        sp->line++;
        continue;
    EOFG4:
        NeedBits16(13, BADG4);
    BADG4:
#ifdef FAX3_DEBUG
        if (GetBits(13) != 0x1001)
            fputs("Bad EOFB\n", stderr);
#endif
        ClrBits(13);
        if (((lastx + 7) >> 3) > (int)occ) /* check for buffer overrun */
        {
            TIFFErrorExtR(tif, module,
                          "Buffer overrun detected : %" TIFF_SSIZE_FORMAT
                          " bytes available, %d bits needed",
                          occ, lastx);
            return -1;
        }
        (*sp->fill)(buf, thisrun, pa, lastx);
        UNCACHE_STATE(tif, sp);
        return (sp->line ? 1 : -1); /* don't error on badly-terminated strips */
    }
    UNCACHE_STATE(tif, sp);
    return (1);
}